

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

void Js::JavascriptObject::CopyDataPropertiesForGenericObjects<false>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  BOOLEAN BVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  EnumeratorCache *pEVar5;
  JavascriptString *propertyString;
  PropertyString *this;
  undefined1 local_d0 [8];
  JavascriptStaticEnumerator enumerator;
  PropertyRecord *propertyRecord;
  Var local_40;
  Var propValue;
  PropertyId nextKey;
  
  pEVar5 = JavascriptLibrary::GetObjectAssignCache
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,(from->type).ptr);
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_d0);
  iVar3 = (*(from->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (from,(JavascriptStaticEnumerator *)local_d0,0xe,scriptContext,pEVar5);
  if (iVar3 == 0) {
    return;
  }
  propValue._4_4_ = 0xffffffff;
  local_40 = (Var)0x0;
  do {
    do {
      propertyString =
           JavascriptStaticEnumerator::MoveAndGetNext
                     ((JavascriptStaticEnumerator *)local_d0,(PropertyId *)((long)&propValue + 4),
                      (PropertyAttributes *)0x0);
      if (propertyString == (JavascriptString *)0x0) {
        return;
      }
      if (propValue._4_4_ == 0xffffffff) {
        enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)0x0;
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,propertyString,(PropertyRecord **)&enumerator.arrayEnumerator);
        propValue._4_4_ =
             *(BVIndex *)&((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).type.ptr;
      }
    } while ((excluded != (BVSparse<Memory::Recycler> *)0x0) &&
            (BVar1 = BVSparse<Memory::Recycler>::Test(excluded,propValue._4_4_), BVar1 != '\0'));
    bVar2 = VarIsImpl<Js::PropertyString>(&propertyString->super_RecyclableObject);
    if (bVar2) {
      this = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(propertyString);
    }
    else {
      this = (PropertyString *)0x0;
    }
    enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)0x0;
  } while ((((this != (PropertyString *)0x0) &&
            (bVar2 = PropertyString::TryGetPropertyFromCache<true,false>
                               (this,from,from,&local_40,scriptContext,
                                (PropertyValueInfo *)&enumerator.arrayEnumerator), bVar2)) ||
           (BVar4 = JavascriptOperators::GetOwnProperty
                              (from,propValue._4_4_,&local_40,scriptContext,
                               (PropertyValueInfo *)&enumerator.arrayEnumerator), BVar4 != 0)) &&
          (BVar4 = CreateDataProperty(to,propValue._4_4_,local_40,scriptContext), BVar4 != 0));
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,L"Object.Spread");
}

Assistant:

void JavascriptObject::CopyDataPropertiesForGenericObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper

    EnumeratorCache* cache = scriptContext->GetLibrary()->GetObjectAssignCache(from->GetType());
    JavascriptStaticEnumerator enumerator;
    if (!from->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EnumSymbols | EnumeratorFlags::UseCache, scriptContext, cache))
    {
        // Nothing to enumerate, continue with the nextSource.
        return;
    }

    PropertyId nextKey = Constants::NoProperty;
    Var propValue = nullptr;
    JavascriptString * propertyName = nullptr;

    // Enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != NULL)
    {
        // Make sure nextKey is defined for the current propertyName
        if (nextKey == Constants::NoProperty)
        {
            PropertyRecord const * propertyRecord = nullptr;

            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            nextKey = propertyRecord->GetPropertyId();
        }

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(nextKey);
        }
        if (!found)
        {
            PropertyString * propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);

            // If propertyName is a PropertyString* we can try getting the property from the inline cache to avoid having a full property lookup
            //
            // Whenever possible, our enumerator populates the cache, so we should generally get a cache hit here
            PropertyValueInfo getPropertyInfo;
            if (propertyString == nullptr || !propertyString->TryGetPropertyFromCache<true /* OwnPropertyOnly */, false /* OutputExistence */>(from, from, &propValue, scriptContext, &getPropertyInfo))
            {
                if (!JavascriptOperators::GetOwnProperty(from, nextKey, &propValue, scriptContext, &getPropertyInfo))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }

            if (assign)
            {
                // Similarly, try to set the property using our cache to avoid having to do the full work of SetProperty
                PropertyValueInfo setPropertyInfo;
                if (propertyString == nullptr || !propertyString->TrySetPropertyFromCache(to, propValue, scriptContext, PropertyOperation_ThrowIfNonWritable, &setPropertyInfo))
                {
                    if (!JavascriptOperators::SetProperty(to, to, nextKey, propValue, &setPropertyInfo, scriptContext, PropertyOperation_ThrowIfNonWritable))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                }
            }
            else
            {
                //TODO[t-huyan]: potentially use caching to improve efficiency? (see AssignForGenericObjects implementation)
                if (!CreateDataProperty(to, nextKey, propValue, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }
        }
    }
}